

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

example * VW::new_unused_example(vw *all)

{
  uint64_t *puVar1;
  example *peVar2;
  
  peVar2 = get_unused_example(all);
  (*(all->p->lp).default_label)(&peVar2->l);
  puVar1 = &all->p->begin_parsed_examples;
  *puVar1 = *puVar1 + 1;
  peVar2->example_counter = all->p->begin_parsed_examples;
  return peVar2;
}

Assistant:

example* new_unused_example(vw& all)
{
  example* ec = &get_unused_example(&all);
  all.p->lp.default_label(&ec->l);
  all.p->begin_parsed_examples++;
  ec->example_counter = (size_t)all.p->begin_parsed_examples;
  return ec;
}